

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Minisat::ClauseAllocator::reloc(ClauseAllocator *this,CRef *cr,ClauseAllocator *to)

{
  bool bVar1;
  CRef CVar2;
  uint32_t uVar3;
  int iVar4;
  Clause *pCVar5;
  Clause *pCVar6;
  uint32_t *puVar7;
  float *pfVar8;
  CRef *in_RSI;
  Clause *c;
  Ref in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar9;
  Clause *in_stack_ffffffffffffffb0;
  Clause *in_stack_ffffffffffffffb8;
  ClauseAllocator *in_stack_ffffffffffffffc0;
  
  pCVar5 = operator[]((ClauseAllocator *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  bVar1 = Clause::reloced(pCVar5);
  if (bVar1) {
    CVar2 = Clause::relocation(pCVar5);
    *in_RSI = CVar2;
  }
  else {
    Clause::learnt(pCVar5);
    CVar2 = alloc<Minisat::Clause>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    *in_RSI = CVar2;
    Clause::relocate(pCVar5,*in_RSI);
    pCVar6 = operator[]((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    uVar3 = Clause::mark(pCVar5);
    Clause::mark(pCVar6,uVar3);
    pCVar6 = operator[]((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    bVar1 = Clause::learnt(pCVar6);
    if (bVar1) {
      puVar7 = Clause::touched(pCVar5);
      uVar3 = *puVar7;
      pCVar6 = operator[]((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                          in_stack_ffffffffffffff9c);
      puVar7 = Clause::touched(pCVar6);
      *puVar7 = uVar3;
      pfVar8 = Clause::activity(pCVar5);
      fVar9 = *pfVar8;
      pCVar6 = operator[]((ClauseAllocator *)CONCAT44(fVar9,uVar3),in_stack_ffffffffffffff9c);
      pfVar8 = Clause::activity(pCVar6);
      *pfVar8 = fVar9;
      pCVar6 = operator[]((ClauseAllocator *)CONCAT44(fVar9,uVar3),in_stack_ffffffffffffff9c);
      iVar4 = Clause::lbd(pCVar5);
      Clause::set_lbd(pCVar6,iVar4);
      pCVar6 = operator[]((ClauseAllocator *)CONCAT44(fVar9,uVar3),in_stack_ffffffffffffff9c);
      bVar1 = Clause::removable(pCVar5);
      Clause::removable(pCVar6,bVar1);
      pCVar6 = operator[]((ClauseAllocator *)CONCAT44(fVar9,uVar3),in_stack_ffffffffffffff9c);
      iVar4 = Clause::S(pCVar5);
      Clause::S(pCVar6,iVar4);
      pCVar6 = operator[]((ClauseAllocator *)CONCAT44(fVar9,uVar3),in_stack_ffffffffffffff9c);
      bVar1 = Clause::simplified(pCVar5);
      Clause::setSimplified(pCVar6,bVar1);
    }
    else {
      pCVar5 = operator[]((ClauseAllocator *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      bVar1 = Clause::has_extra(pCVar5);
      if (bVar1) {
        operator[]((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
        Clause::calcAbstraction(in_stack_ffffffffffffffb0);
      }
    }
  }
  return;
}

Assistant:

void reloc(CRef &cr, ClauseAllocator &to)
    {
        Clause &c = operator[](cr);

        if (c.reloced()) {
            cr = c.relocation();
            return;
        }

        cr = to.alloc(c, c.learnt());
        c.relocate(cr);

        // Copy extra data-fields:
        // (This could be cleaned-up. Generalize Clause-constructor to be applicable here instead?)
        to[cr].mark(c.mark());
        if (to[cr].learnt()) {
            to[cr].touched() = c.touched();
            to[cr].activity() = c.activity();
            to[cr].set_lbd(c.lbd());
            to[cr].removable(c.removable());
            to[cr].S(c.S());
            // simplify
            //
            to[cr].setSimplified(c.simplified());
        } else if (to[cr].has_extra())
            to[cr].calcAbstraction();
    }